

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_bench_sqlite3.cc
# Opt level: O3

void __thiscall leveldb::Benchmark::Read(Benchmark *this,Order order,int entries_per_batch)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  FILE *pFVar2;
  uint uVar3;
  uint extraout_EAX;
  uint extraout_EAX_00;
  uint extraout_EAX_01;
  uint extraout_EAX_02;
  uint extraout_EAX_03;
  uint extraout_EAX_04;
  uint extraout_EAX_05;
  uint extraout_EAX_06;
  uint extraout_EAX_07;
  uint extraout_EAX_08;
  uint extraout_EAX_09;
  uint extraout_EAX_10;
  uint extraout_EAX_11;
  int iVar4;
  Env *pEVar5;
  undefined4 extraout_var;
  size_t sVar6;
  long *plVar7;
  ulong uVar8;
  long *plVar9;
  char *pcVar10;
  uint uVar11;
  Benchmark *pBVar12;
  Benchmark *pBVar13;
  Benchmark *this_00;
  char *unaff_R12;
  ulong unaff_R13;
  Benchmark *pBVar14;
  undefined1 auVar15 [16];
  sqlite3_stmt *read_stmt;
  sqlite3_stmt *end_trans_stmt;
  sqlite3_stmt *begin_trans_stmt;
  string end_trans_str;
  string read_str;
  string begin_trans_str;
  char key [100];
  long *plStack_220;
  long lStack_218;
  long lStack_210;
  long lStack_208;
  double dStack_200;
  double dStack_1f8;
  undefined1 *apuStack_1f0 [2];
  undefined1 auStack_1e0 [16];
  long *plStack_1d0;
  long lStack_1c8;
  long lStack_1c0;
  long lStack_1b8;
  string asStack_1b0 [3];
  Benchmark *pBStack_148;
  char *pcStack_140;
  ulong uStack_138;
  Benchmark *pBStack_130;
  Benchmark *pBStack_128;
  code *pcStack_120;
  undefined8 local_110;
  undefined8 local_108;
  undefined8 local_100;
  Benchmark *local_f8 [2];
  undefined1 local_e8 [16];
  Benchmark *local_d8;
  undefined1 local_c8 [16];
  undefined1 local_b8 [32];
  char local_98 [104];
  
  pBVar12 = (Benchmark *)(ulong)(uint)entries_per_batch;
  local_d8 = (Benchmark *)local_c8;
  pcStack_120 = (code *)0x107049;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d8,"SELECT * FROM test WHERE key = ?","");
  local_b8._0_8_ = local_b8 + 0x10;
  pBVar14 = (Benchmark *)local_b8;
  pcStack_120 = (code *)0x10706d;
  std::__cxx11::string::_M_construct<char_const*>((string *)pBVar14,"BEGIN TRANSACTION;","");
  local_f8[0] = (Benchmark *)local_e8;
  pcStack_120 = (code *)0x10708e;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"END TRANSACTION;","");
  pcStack_120 = (code *)0x1070a6;
  pBVar13 = (Benchmark *)local_b8._0_8_;
  uVar3 = sqlite3_prepare_v2(this->db_,local_b8._0_8_,0xffffffff,&local_100,0);
  if (uVar3 == 0) {
    pcStack_120 = (code *)0x1070c8;
    pBVar13 = local_f8[0];
    uVar3 = sqlite3_prepare_v2(this->db_,local_f8[0],0xffffffff,&local_108,0);
    if (uVar3 != 0) goto LAB_0010731f;
    pcStack_120 = (code *)0x1070ea;
    pBVar13 = local_d8;
    uVar3 = sqlite3_prepare_v2(this->db_,local_d8,0xffffffff,&local_110,0);
    if (uVar3 != 0) goto LAB_00107326;
    if (0 < this->reads_) {
      unaff_R12 = local_98;
      unaff_R13 = 0;
      do {
        if ((1 < entries_per_batch) && ((FLAGS_transaction & 1) == 0)) {
          pcStack_120 = (code *)0x107121;
          uVar3 = sqlite3_step(local_100);
          if (uVar3 == 0x65) {
            pcStack_120 = (code *)0x107134;
            uVar3 = sqlite3_reset(local_100);
            if (uVar3 == 0) goto LAB_00107145;
          }
          else {
LAB_001072fc:
            pcStack_120 = (code *)0x107303;
            Read((Benchmark *)(ulong)uVar3);
            uVar3 = extraout_EAX_03;
          }
          pcStack_120 = (code *)0x10730a;
          Read((Benchmark *)(ulong)uVar3);
          uVar3 = extraout_EAX_04;
LAB_0010730a:
          pcStack_120 = (code *)0x107311;
          Read((Benchmark *)(ulong)uVar3);
          uVar3 = extraout_EAX_05;
LAB_00107311:
          pcStack_120 = (code *)0x107318;
          Read((Benchmark *)(ulong)uVar3);
          uVar3 = extraout_EAX_06;
          goto LAB_00107318;
        }
        if (0 < entries_per_batch) {
LAB_00107145:
          pBVar14 = (Benchmark *)0x0;
          do {
            if (order == SEQUENTIAL) {
              uVar8 = (ulong)(uint)((int)pBVar14 + (int)unaff_R13);
            }
            else {
              uVar8 = (ulong)(this->rand_).seed_ * 0x41a7;
              uVar3 = (uint)uVar8 & 0x7fffffff;
              iVar4 = (int)(uVar8 >> 0x1f);
              uVar11 = iVar4 + uVar3;
              uVar3 = iVar4 + uVar3 + 0x80000001;
              if (-1 < (int)uVar11) {
                uVar3 = uVar11;
              }
              (this->rand_).seed_ = uVar3;
              uVar8 = (ulong)uVar3 % (ulong)(uint)this->reads_;
            }
            pcStack_120 = (code *)0x10719f;
            snprintf(unaff_R12,100,"%016d",uVar8);
            pBVar13 = (Benchmark *)0x1;
            pcStack_120 = (code *)0x1071b9;
            uVar3 = sqlite3_bind_blob(local_110,1,unaff_R12,0x10,0);
            if (uVar3 != 0) {
LAB_001072e7:
              pcStack_120 = (code *)0x1072ee;
              Read((Benchmark *)(ulong)uVar3);
              uVar3 = extraout_EAX_00;
LAB_001072ee:
              pcStack_120 = (code *)0x1072f5;
              Read((Benchmark *)(ulong)uVar3);
              uVar3 = extraout_EAX_01;
LAB_001072f5:
              pcStack_120 = (code *)0x1072fc;
              Read((Benchmark *)(ulong)uVar3);
              uVar3 = extraout_EAX_02;
              goto LAB_001072fc;
            }
            do {
              pcStack_120 = (code *)0x1071cb;
              uVar3 = sqlite3_step(local_110);
            } while (uVar3 == 100);
            if (uVar3 != 0x65) {
              pcStack_120 = (code *)0x1072e7;
              Read((Benchmark *)(ulong)uVar3);
              uVar3 = extraout_EAX;
              goto LAB_001072e7;
            }
            pcStack_120 = (code *)0x1071e3;
            uVar3 = sqlite3_clear_bindings(local_110);
            if (uVar3 != 0) goto LAB_001072ee;
            pcStack_120 = (code *)0x1071f5;
            uVar3 = sqlite3_reset(local_110);
            if (uVar3 != 0) goto LAB_001072f5;
            pcStack_120 = (code *)0x107205;
            FinishedSingleOp(this);
            uVar3 = (int)pBVar14 + 1;
            pBVar14 = (Benchmark *)(ulong)uVar3;
          } while (uVar3 != entries_per_batch);
          if (1 < entries_per_batch && (FLAGS_transaction & 1) == 0) {
            pcStack_120 = (code *)0x10722e;
            uVar3 = sqlite3_step(local_108);
            if (uVar3 != 0x65) goto LAB_0010730a;
            pcStack_120 = (code *)0x107241;
            uVar3 = sqlite3_reset(local_108);
            if (uVar3 != 0) goto LAB_00107311;
          }
        }
        uVar3 = (int)unaff_R13 + entries_per_batch;
        unaff_R13 = (ulong)uVar3;
      } while ((int)uVar3 < this->reads_);
    }
    pcStack_120 = (code *)0x107266;
    uVar3 = sqlite3_finalize(local_110);
    if (uVar3 != 0) goto LAB_0010732d;
    pcStack_120 = (code *)0x107278;
    uVar3 = sqlite3_finalize(local_100);
    pBVar12 = (Benchmark *)local_c8;
    this = (Benchmark *)(local_b8 + 0x10);
    pBVar14 = (Benchmark *)local_e8;
    if (uVar3 == 0) {
      pcStack_120 = (code *)0x107299;
      uVar3 = sqlite3_finalize(local_108);
      if (uVar3 == 0) {
        if (local_f8[0] != pBVar14) {
          pcStack_120 = (code *)0x1072b0;
          operator_delete(local_f8[0]);
        }
        if ((Benchmark *)local_b8._0_8_ != this) {
          pcStack_120 = (code *)0x1072bf;
          operator_delete((void *)local_b8._0_8_);
        }
        if (local_d8 != pBVar12) {
          pcStack_120 = (code *)0x1072ce;
          operator_delete(local_d8);
        }
        return;
      }
      goto LAB_0010733b;
    }
  }
  else {
LAB_00107318:
    pcStack_120 = (code *)0x10731f;
    Read((Benchmark *)(ulong)uVar3);
    uVar3 = extraout_EAX_07;
LAB_0010731f:
    pcStack_120 = (code *)0x107326;
    Read((Benchmark *)(ulong)uVar3);
    uVar3 = extraout_EAX_08;
LAB_00107326:
    pcStack_120 = (code *)0x10732d;
    Read((Benchmark *)(ulong)uVar3);
    uVar3 = extraout_EAX_09;
LAB_0010732d:
    pcStack_120 = (code *)0x107334;
    Read((Benchmark *)(ulong)uVar3);
    uVar3 = extraout_EAX_10;
  }
  pcStack_120 = (code *)0x10733b;
  Read((Benchmark *)(ulong)uVar3);
  uVar3 = extraout_EAX_11;
LAB_0010733b:
  this_00 = (Benchmark *)(ulong)uVar3;
  pcStack_120 = Stop;
  Read(this_00);
  pBStack_148 = pBVar12;
  pcStack_140 = unaff_R12;
  uStack_138 = unaff_R13;
  pBStack_130 = this;
  pBStack_128 = pBVar14;
  pcStack_120 = (code *)(ulong)order;
  pEVar5 = Env::Default();
  iVar4 = (*pEVar5->_vptr_Env[0x15])(pEVar5);
  auVar15._4_4_ = extraout_var;
  auVar15._0_4_ = iVar4;
  auVar15._8_4_ = extraout_var;
  auVar15._12_4_ = 0x45300000;
  dStack_1f8 = auVar15._8_8_ - 1.9342813113834067e+25;
  if (this_00->done_ < 1) {
    this_00->done_ = 1;
  }
  dStack_200 = (dStack_1f8 + ((double)CONCAT44(0x43300000,iVar4) - 4503599627370496.0)) * 1e-06;
  if (0 < this_00->bytes_) {
    snprintf((char *)asStack_1b0,100,"%6.1f MB/s",
             ((double)this_00->bytes_ * 9.5367431640625e-07) / (dStack_200 - this_00->start_));
    if ((this_00->message_)._M_string_length == 0) {
      strlen((char *)asStack_1b0);
      std::__cxx11::string::_M_replace((ulong)&this_00->message_,0,(char *)0x0,(ulong)asStack_1b0);
    }
    else {
      apuStack_1f0[0] = auStack_1e0;
      sVar6 = strlen((char *)asStack_1b0);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)apuStack_1f0,asStack_1b0,(long)&asStack_1b0[0]._M_dataplus._M_p + sVar6);
      plVar7 = (long *)std::__cxx11::string::append((char *)apuStack_1f0);
      plVar9 = plVar7 + 2;
      if ((long *)*plVar7 == plVar9) {
        lStack_210 = *plVar9;
        lStack_208 = plVar7[3];
        plStack_220 = &lStack_210;
      }
      else {
        lStack_210 = *plVar9;
        plStack_220 = (long *)*plVar7;
      }
      lStack_218 = plVar7[1];
      *plVar7 = (long)plVar9;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&plStack_220,(ulong)(this_00->message_)._M_dataplus._M_p);
      plVar9 = plVar7 + 2;
      if ((long *)*plVar7 == plVar9) {
        lStack_1c0 = *plVar9;
        lStack_1b8 = plVar7[3];
        plStack_1d0 = &lStack_1c0;
      }
      else {
        lStack_1c0 = *plVar9;
        plStack_1d0 = (long *)*plVar7;
      }
      lStack_1c8 = plVar7[1];
      *plVar7 = (long)plVar9;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      std::__cxx11::string::operator=((string *)&this_00->message_,(string *)&plStack_1d0);
      if (plStack_1d0 != &lStack_1c0) {
        operator_delete(plStack_1d0);
      }
      if (plStack_220 != &lStack_210) {
        operator_delete(plStack_220);
      }
      if (apuStack_1f0[0] != auStack_1e0) {
        operator_delete(apuStack_1f0[0]);
      }
    }
  }
  pFVar2 = _stdout;
  paVar1 = &asStack_1b0[0].field_2;
  asStack_1b0[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)asStack_1b0,pBVar13->db_,pBVar13->db_ + *(long *)&pBVar13->db_num_);
  pcVar10 = " ";
  if ((this_00->message_)._M_string_length == 0) {
    pcVar10 = "";
  }
  fprintf(pFVar2,"%-12s : %11.3f micros/op;%s%s\n",
          ((dStack_200 - this_00->start_) * 1000000.0) / (double)this_00->done_,
          asStack_1b0[0]._M_dataplus._M_p,pcVar10,(this_00->message_)._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)asStack_1b0[0]._M_dataplus._M_p != paVar1) {
    operator_delete(asStack_1b0[0]._M_dataplus._M_p);
  }
  pFVar2 = _stdout;
  if (FLAGS_histogram == true) {
    Histogram::ToString_abi_cxx11_(asStack_1b0,&this_00->hist_);
    fprintf(pFVar2,"Microseconds per op:\n%s\n",asStack_1b0[0]._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)asStack_1b0[0]._M_dataplus._M_p != paVar1) {
      operator_delete(asStack_1b0[0]._M_dataplus._M_p);
    }
  }
  fflush(_stdout);
  return;
}

Assistant:

void Read(Order order, int entries_per_batch) {
    int status;
    sqlite3_stmt *read_stmt, *begin_trans_stmt, *end_trans_stmt;

    std::string read_str = "SELECT * FROM test WHERE key = ?";
    std::string begin_trans_str = "BEGIN TRANSACTION;";
    std::string end_trans_str = "END TRANSACTION;";

    // Preparing sqlite3 statements
    status = sqlite3_prepare_v2(db_, begin_trans_str.c_str(), -1,
                                &begin_trans_stmt, nullptr);
    ErrorCheck(status);
    status = sqlite3_prepare_v2(db_, end_trans_str.c_str(), -1, &end_trans_stmt,
                                nullptr);
    ErrorCheck(status);
    status = sqlite3_prepare_v2(db_, read_str.c_str(), -1, &read_stmt, nullptr);
    ErrorCheck(status);

    bool transaction = (entries_per_batch > 1);
    for (int i = 0; i < reads_; i += entries_per_batch) {
      // Begin read transaction
      if (FLAGS_transaction && transaction) {
        status = sqlite3_step(begin_trans_stmt);
        StepErrorCheck(status);
        status = sqlite3_reset(begin_trans_stmt);
        ErrorCheck(status);
      }

      // Create and execute SQL statements
      for (int j = 0; j < entries_per_batch; j++) {
        // Create key value
        char key[100];
        int k = (order == SEQUENTIAL) ? i + j : (rand_.Next() % reads_);
        std::snprintf(key, sizeof(key), "%016d", k);

        // Bind key value into read_stmt
        status = sqlite3_bind_blob(read_stmt, 1, key, 16, SQLITE_STATIC);
        ErrorCheck(status);

        // Execute read statement
        while ((status = sqlite3_step(read_stmt)) == SQLITE_ROW) {
        }
        StepErrorCheck(status);

        // Reset SQLite statement for another use
        status = sqlite3_clear_bindings(read_stmt);
        ErrorCheck(status);
        status = sqlite3_reset(read_stmt);
        ErrorCheck(status);
        FinishedSingleOp();
      }

      // End read transaction
      if (FLAGS_transaction && transaction) {
        status = sqlite3_step(end_trans_stmt);
        StepErrorCheck(status);
        status = sqlite3_reset(end_trans_stmt);
        ErrorCheck(status);
      }
    }

    status = sqlite3_finalize(read_stmt);
    ErrorCheck(status);
    status = sqlite3_finalize(begin_trans_stmt);
    ErrorCheck(status);
    status = sqlite3_finalize(end_trans_stmt);
    ErrorCheck(status);
  }